

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O2

FFSTypeHandle_conflict FFSnext_type_handle(FFSFile ffsfile)

{
  FFSTypeHandle_conflict p_Var1;
  int iVar2;
  
  if (ffsfile->status == OpenForRead) {
    if (ffsfile->read_ahead == 0) {
      next_record_type(ffsfile);
    }
    do {
      if (ffsfile->next_record_type == FFSdata) {
        if (ffsfile->next_actual_handle->status == not_checked) {
          FFS_determine_conversion(ffsfile->c,ffsfile->next_actual_handle);
          p_Var1 = ffsfile->next_actual_handle->conversion_target;
          ffsfile->next_data_handle = p_Var1;
          return p_Var1;
        }
        return ffsfile->next_data_handle;
      }
      iVar2 = FFSconsume_next_item(ffsfile);
    } while (iVar2 != 0);
  }
  return (FFSTypeHandle_conflict)0x0;
}

Assistant:

extern
FFSTypeHandle
FFSnext_type_handle(FFSFile ffsfile)
{
    if (ffsfile->status != OpenForRead)
	return NULL;

    if (ffsfile->read_ahead == FALSE) {
	(void) next_record_type(ffsfile);
    }
    while (ffsfile->next_record_type != FFSdata) {
	if (!FFSconsume_next_item(ffsfile)) return NULL;
    }
    if (ffsfile->next_actual_handle->status == not_checked) {
	FFS_determine_conversion(ffsfile->c, ffsfile->next_actual_handle);
	ffsfile->next_data_handle = ffsfile->next_actual_handle->conversion_target;
    }
    return ffsfile->next_data_handle;
}